

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

string * __thiscall
soul::StructuralParser::parseAnnotationKey_abi_cxx11_
          (string *__return_storage_ptr__,StructuralParser *this)

{
  bool bVar1;
  char *__s;
  allocator<char> local_11;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::matchesAny<soul::TokenType,soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this,(TokenType)0x2a3337,(TokenType)0x2a34c2);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&(this->super_SOULTokeniser).currentStringValue);
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x2c89e5);
    if (bVar1) {
      __s = "if";
    }
    else {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a6d);
      if (bVar1) {
        __s = "do";
      }
      else {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x2c84ab);
        if (bVar1) {
          __s = "for";
        }
        else {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a70);
          if (bVar1) {
            __s = "let";
          }
          else {
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a74);
            if (bVar1) {
              __s = "var";
            }
            else {
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matches(&this->super_SOULTokeniser,(TokenType)0x2c5d43);
              if (bVar1) {
                __s = "int";
              }
              else {
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a78);
                if (bVar1) {
                  __s = "try";
                }
                else {
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a7c);
                  if (bVar1) {
                    __s = "else";
                  }
                  else {
                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3237);
                    if (bVar1) {
                      __s = "bool";
                    }
                    else {
                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matches(&this->super_SOULTokeniser,(TokenType)0x2c6d2f);
                      if (bVar1) {
                        __s = "true";
                      }
                      else {
                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a81);
                        if (bVar1) {
                          __s = "case";
                        }
                        else {
                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a86);
                          if (bVar1) {
                            __s = "enum";
                          }
                          else {
                            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    ::matches(&this->super_SOULTokeniser,(TokenType)0x2c76a7);
                            if (bVar1) {
                              __s = "loop";
                            }
                            else {
                              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                      ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3174);
                              if (bVar1) {
                                __s = "void";
                              }
                              else {
                                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                        ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a8b);
                                if (bVar1) {
                                  __s = "while";
                                }
                                else {
                                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                          ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2a91);
                                  if (bVar1) {
                                    __s = "break";
                                  }
                                  else {
                                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                            ::matches(&this->super_SOULTokeniser,(TokenType)0x2c481a
                                                     );
                                    if (bVar1) {
                                      __s = "const";
                                    }
                                    else {
                                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                              ::matches(&this->super_SOULTokeniser,
                                                        (TokenType)0x2a31de);
                                      if (bVar1) {
                                        __s = "int32";
                                      }
                                      else {
                                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                ::matches(&this->super_SOULTokeniser,
                                                          (TokenType)0x2a31f4);
                                        if (bVar1) {
                                          __s = "int64";
                                        }
                                        else {
                                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2a97);
                                          if (bVar1) {
                                            __s = "float";
                                          }
                                          else {
                                            bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c6d63);
                                            if (bVar1) {
                                              __s = "false";
                                            }
                                            else {
                                              bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2a9d);
                                              if (bVar1) {
                                                __s = "using";
                                              }
                                              else {
                                                bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2003);
                                                if (bVar1) {
                                                  __s = "fixed";
                                                }
                                                else {
                                                  bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c6bac);
                                                  if (bVar1) {
                                                    __s = "graph";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x29fc41);
                                                  if (bVar1) {
                                                    __s = "input";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2aa3);
                                                  if (bVar1) {
                                                    __s = "event";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2aa9);
                                                  if (bVar1) {
                                                    __s = "class";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2aaf);
                                                  if (bVar1) {
                                                    __s = "catch";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2ab5);
                                                  if (bVar1) {
                                                    __s = "throw";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c8374);
                                                  if (bVar1) {
                                                    __s = "output";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2abb);
                                                  if (bVar1) {
                                                    __s = "return";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a3269);
                                                  if (bVar1) {
                                                    __s = "string";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c6756);
                                                  if (bVar1) {
                                                    __s = "struct";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2ac2);
                                                  if (bVar1) {
                                                    __s = "import";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2ac9);
                                                  if (bVar1) {
                                                    __s = "switch";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2ad0);
                                                  if (bVar1) {
                                                    __s = "public";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2ad7);
                                                  if (bVar1) {
                                                    __s = "double";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2ade);
                                                  if (bVar1) {
                                                    __s = "private";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a3209);
                                                  if (bVar1) {
                                                    __s = "float32";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a3220);
                                                  if (bVar1) {
                                                    __s = "float64";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2ae6);
                                                  if (bVar1) {
                                                    __s = "default";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2550);
                                                  if (bVar1) {
                                                    __s = "complex";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2aee);
                                                  if (bVar1) {
                                                    __s = "continue";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2af7);
                                                  if (bVar1) {
                                                    __s = "external";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c6ef1);
                                                  if (bVar1) {
                                                    __s = "operator";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c4fee);
                                                  if (bVar1) {
                                                    __s = "processor";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c4a69);
                                                  if (bVar1) {
                                                    __s = "namespace";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2009);
                                                  if (bVar1) {
                                                    __s = "complex32";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2a2013);
                                                  if (bVar1) {
                                                    __s = "complex64";
                                                  }
                                                  else {
                                                    bVar1 = 
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::matches(&this->super_SOULTokeniser,
                                                            (TokenType)0x2c57f8);
                                                  if (!bVar1) {
                                                                                                        
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  ::expect<soul::TokenType>
                                                            (&this->super_SOULTokeniser,
                                                             (TokenType)0x2a3337);
                                                  (__return_storage_ptr__->_M_dataplus)._M_p =
                                                       (pointer)&__return_storage_ptr__->field_2;
                                                  __return_storage_ptr__->_M_string_length = 0;
                                                  (__return_storage_ptr__->field_2)._M_local_buf[0]
                                                       = '\0';
                                                  return __return_storage_ptr__;
                                                  }
                                                  __s = "connection";
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseAnnotationKey()
    {
        if (matchesAny (Token::identifier, Token::literalString))
            return currentStringValue;

        #define SOUL_CHECK_KEYWORD(name, str) if (matches (Keyword::name)) return str;
        SOUL_KEYWORDS (SOUL_CHECK_KEYWORD)
        #undef SOUL_CHECK_KEYWORD

        expect (Token::identifier);
        return {};
    }